

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

ServiceDescriptorProto *
google::protobuf::descriptor_unittest::AddService(FileDescriptorProto *file,string *name)

{
  ServiceDescriptorProto *this;
  uint32_t *puVar1;
  Arena *arena;
  ServiceDescriptorProto *result;
  string *name_local;
  FileDescriptorProto *file_local;
  
  this = FileDescriptorProto::add_service(file);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this);
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,name,arena);
  return this;
}

Assistant:

ServiceDescriptorProto* AddService(FileDescriptorProto* file,
                                   const std::string& name) {
  ServiceDescriptorProto* result = file->add_service();
  result->set_name(name);
  return result;
}